

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

void __thiscall
FCompileContext::CheckReturn(FCompileContext *this,PPrototype *proto,FScriptPosition *pos)

{
  PType **ppPVar1;
  PType **ppPVar2;
  uint uVar3;
  undefined8 in_RAX;
  PPrototype *pPVar4;
  uint uVar5;
  PPrototype *pPVar6;
  ulong uVar7;
  
  if (proto == (PPrototype *)0x0) {
    __assert_fail("proto != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x7b,"void FCompileContext::CheckReturn(PPrototype *, FScriptPosition &)");
  }
  pPVar6 = this->ReturnProto;
  if (pPVar6 != (PPrototype *)0x0) {
    uVar3 = (pPVar6->ReturnTypes).Count;
    uVar5 = (proto->ReturnTypes).Count;
    pPVar4 = proto;
    if (uVar3 < uVar5) {
      this->ReturnProto = proto;
      pPVar4 = pPVar6;
      pPVar6 = proto;
      uVar5 = uVar3;
    }
    if (uVar5 == 0) {
      if ((pPVar6->ReturnTypes).Count == 0) {
        return;
      }
    }
    else {
      uVar7 = 0;
      do {
        if (uVar5 == uVar7) {
          return;
        }
        ppPVar1 = (pPVar6->ReturnTypes).Array + uVar7;
        ppPVar2 = (pPVar4->ReturnTypes).Array + uVar7;
        uVar7 = uVar7 + 1;
      } while (*ppPVar1 == *ppPVar2);
    }
    FScriptPosition::Message(pos,2,"All return expressions must deduce to the same type",in_RAX);
    return;
  }
  this->ReturnProto = proto;
  return;
}

Assistant:

void FCompileContext::CheckReturn(PPrototype *proto, FScriptPosition &pos)
{
	assert(proto != nullptr);
	bool fail = false;

	if (ReturnProto == nullptr)
	{
		ReturnProto = proto;
		return;
	}

	// A prototype that defines fewer return types can be compatible with
	// one that defines more if the shorter one matches the initial types
	// for the longer one.
	if (ReturnProto->ReturnTypes.Size() < proto->ReturnTypes.Size())
	{ // Make proto the shorter one to avoid code duplication below.
		swapvalues(proto, ReturnProto);
	}
	// If one prototype returns nothing, they both must.
	if (proto->ReturnTypes.Size() == 0)
	{
		if (ReturnProto->ReturnTypes.Size() != 0)
		{
			fail = true;
		}
	}
	else
	{
		for (unsigned i = 0; i < proto->ReturnTypes.Size(); i++)
		{
			if (ReturnProto->ReturnTypes[i] != proto->ReturnTypes[i])
			{ // Incompatible
				fail = true;
				break;
			}
		}
	}

	if (fail)
	{
		pos.Message(MSG_ERROR, "All return expressions must deduce to the same type");
	}
}